

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onesided.c
# Opt level: O2

void gai_gatscat_new(int op,Integer g_a,void *v,void *subscript,Integer c_flag,Integer nv,
                    double *locbytes,double *totbytes,void *alpha)

{
  ulong uVar1;
  global_array_t *pgVar2;
  void **ptr;
  short sVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  int op_00;
  Integer IVar7;
  ushort uVar8;
  long lVar9;
  ulong uVar10;
  logical lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  C_Integer CVar17;
  ulong uVar18;
  long lVar19;
  long lVar20;
  Integer *pIVar21;
  int iVar22;
  long lVar23;
  global_array_t *pgVar24;
  ushort uVar25;
  char *string;
  uint uVar26;
  long lVar27;
  ulong uVar28;
  long lVar29;
  Integer _d;
  long lVar30;
  long lVar31;
  long lVar32;
  Integer idx;
  int local_38c;
  void *local_388;
  Integer *local_380;
  void **local_378;
  Integer tproc;
  int local_368;
  uint local_364;
  Integer *local_360;
  void **local_358;
  Integer *local_350;
  long local_348;
  int local_33c;
  long local_338;
  long local_330;
  Integer local_328;
  ulong local_320;
  armci_giov_t desc;
  Integer index [7];
  Integer _lo [7];
  Integer _hi [7];
  Integer lo [7];
  Integer ld [6];
  Integer _index2 [7];
  Integer hi [7];
  
  lVar12 = g_a + 1000;
  local_388 = subscript;
  local_33c = op;
  local_378 = (void **)pnga_nodeid();
  pgVar24 = GA;
  lVar31 = lVar12 * 0x368;
  lVar6 = GA[lVar12].num_rstrctd;
  iVar4 = GA[lVar12].p_handle;
  lVar32 = (long)iVar4;
  if (lVar32 < 0) {
    lVar14 = lVar6;
    if (lVar6 < 1) {
      lVar14 = GAnproc;
    }
  }
  else {
    lVar14 = (long)PGRP_LIST[lVar32].map_nproc;
  }
  lVar23 = (long)GA_prealloc_gatscat;
  if (lVar23 == 0) {
    local_360 = (Integer *)pnga_malloc(lVar14,0x3f2,"ga_gat_header");
    local_350 = (Integer *)pnga_malloc(nv,0x3f2,"ga_gat_list");
    local_380 = (Integer *)pnga_malloc(lVar14,0x3f2,"ga_gat_nelems");
  }
  else {
    if (lVar23 < nv) {
      pnga_error("Gather/scatter vector exceeds allocation length ",lVar23);
    }
    local_360 = GA_header;
    local_350 = GA_list;
    local_380 = GA_elems;
  }
  local_364 = (uint)GA[lVar12].ndim;
  local_330 = (long)(int)local_364;
  iVar5 = GA[lVar12].type;
  local_368 = GA[lVar12].elemsize;
  lVar15 = (long)local_368;
  *totbytes = (double)(lVar15 * nv);
  lVar9 = 0;
  lVar23 = 0;
  if (0 < lVar14) {
    lVar23 = lVar14;
  }
  for (; lVar23 != lVar9; lVar9 = lVar9 + 1) {
    local_380[lVar9] = 0;
    local_360[lVar9] = -1;
  }
  lVar9 = 0;
  local_348 = nv;
  if (nv < 1) {
    local_348 = lVar9;
  }
  for (; local_348 != lVar9; lVar9 = lVar9 + 1) {
    local_350[lVar9] = 0;
  }
  uVar1 = local_330 - 1;
  lVar20 = 0;
  lVar9 = 0;
  if (0 < local_330) {
    lVar9 = local_330;
  }
  uVar18 = 0;
  if (0 < (int)local_364) {
    uVar18 = (ulong)local_364;
  }
  local_338 = g_a * 0x368 + 0xd4ee0;
  uVar10 = 1;
  local_328 = lVar14;
  while( true ) {
    iVar22 = (int)uVar10;
    if (lVar20 == local_348) break;
    if (c_flag == 0) {
      pIVar21 = (Integer *)((long)local_388 + lVar20 * local_330 * 8);
    }
    else {
      uVar10 = uVar1;
      for (lVar14 = 0; lVar9 != lVar14; lVar14 = lVar14 + 1) {
        index[lVar14] = (long)*(int *)(*(long *)((long)local_388 + lVar20 * 8) + uVar10 * 4) + 1;
        uVar10 = uVar10 - 1;
      }
      pIVar21 = index;
    }
    local_320 = (long)iVar22;
    lVar11 = pnga_locate(g_a,pIVar21,&idx);
    if (lVar11 == 0) {
      gai_print_subscript("invalid subscript",local_364,pIVar21,"\n");
      pnga_error("failed -element:",lVar20);
    }
    if (0 < lVar6) {
      idx = GA[lVar12].rank_rstrctd[idx];
    }
    pgVar2 = GA + lVar12;
    iVar22 = GA[lVar12].distr_type;
    if (iVar22 - 3U < 2) {
      sVar3 = pgVar2->ndim;
      uVar26 = (uint)sVar3;
      lVar16 = (long)(int)idx % pgVar2->num_blocks[0];
      index[0] = lVar16;
      lVar14 = 0;
      while (lVar14 + 1 < (long)(int)uVar26) {
        idx = ((int)idx - lVar16) / GA[g_a + 1000].num_blocks[lVar14];
        lVar16 = (long)(int)idx % GA[g_a + 1000].num_blocks[lVar14 + 1];
        index[lVar14 + 1] = lVar16;
        lVar14 = lVar14 + 1;
      }
      for (uVar10 = 0; uVar18 != uVar10; uVar10 = uVar10 + 1) {
        index[uVar10] = index[uVar10] % (long)pgVar24[lVar12].nblock[uVar10];
      }
      uVar10 = 0;
      if (0 < sVar3) {
        uVar10 = (ulong)uVar26;
      }
      for (uVar28 = 0; uVar10 != uVar28; uVar28 = uVar28 + 1) {
        _index2[uVar28] =
             index[uVar28] % (long)*(int *)((long)GA->dims + uVar28 * 4 + local_338 + -0x30);
      }
      idx = ld[(long)(int)uVar26 + 5];
      for (uVar26 = uVar26 - 2; -1 < (int)uVar26; uVar26 = uVar26 - 1) {
        idx = idx * pgVar2->nblock[uVar26] + _index2[uVar26];
      }
    }
    else if (iVar22 == 1) {
      idx = idx % local_328;
    }
    else if (iVar22 == 2) {
      sVar3 = pgVar2->ndim;
      uVar26 = (uint)sVar3;
      lVar16 = (long)(int)idx % pgVar2->num_blocks[0];
      index[0] = lVar16;
      lVar14 = 0;
      while (lVar14 + 1 < (long)(int)uVar26) {
        idx = ((int)idx - lVar16) / GA[g_a + 1000].num_blocks[lVar14];
        lVar16 = (long)(int)idx % GA[g_a + 1000].num_blocks[lVar14 + 1];
        index[lVar14 + 1] = lVar16;
        lVar14 = lVar14 + 1;
      }
      for (uVar10 = 0; uVar18 != uVar10; uVar10 = uVar10 + 1) {
        index[uVar10] = index[uVar10] % (long)pgVar24[lVar12].nblock[uVar10];
      }
      uVar10 = 0;
      if (0 < sVar3) {
        uVar10 = (ulong)uVar26;
      }
      for (uVar28 = 0; uVar10 != uVar28; uVar28 = uVar28 + 1) {
        _index2[uVar28] =
             index[uVar28] % (long)*(int *)((long)GA->dims + uVar28 * 4 + local_338 + -0x30);
      }
      idx = ld[(long)(int)uVar26 + 5];
      for (uVar26 = uVar26 - 2; -1 < (int)uVar26; uVar26 = uVar26 - 1) {
        idx = idx * pgVar2->nblock[uVar26] + _index2[uVar26];
      }
    }
    local_380[idx] = local_380[idx] + 1;
    uVar10 = local_320;
    if ((long)local_320 < local_380[idx]) {
      uVar10 = local_380[idx];
    }
    uVar10 = uVar10 & 0xffffffff;
    IVar7 = local_360[idx];
    local_360[idx] = lVar20;
    local_350[lVar20] = (long)(int)IVar7;
    lVar20 = lVar20 + 1;
  }
  *locbytes = (double)(local_380[(long)local_378] * lVar15);
  local_378 = (void **)malloc((long)(iVar22 * 2) << 3);
  local_358 = local_378 + iVar22;
  lVar12 = (long)local_33c;
  uVar18 = 0;
  if (0 < (int)uVar1) {
    uVar18 = uVar1 & 0xffffffff;
  }
  lVar14 = 0;
  local_320 = lVar31;
  do {
    if (lVar14 == lVar23) {
      free(local_378);
      if (GA_prealloc_gatscat == 0) {
        pnga_free(local_380);
        pnga_free(local_350);
        pnga_free(local_360);
      }
      return;
    }
    if (0 < local_380[lVar14]) {
      lVar20 = 0;
      for (idx = local_360[lVar14]; -1 < idx; idx = local_350[idx]) {
        if (c_flag == 0) {
          pIVar21 = (Integer *)((long)local_388 + idx * local_330 * 8);
        }
        else {
          uVar10 = uVar1;
          for (lVar16 = 0; lVar9 != lVar16; lVar16 = lVar16 + 1) {
            index[lVar16] = (long)*(int *)(*(long *)((long)local_388 + idx * 8) + uVar10 * 4) + 1;
            uVar10 = uVar10 - 1;
          }
          pIVar21 = index;
        }
        uVar10 = lVar31;
        local_348 = lVar20;
        if (*(int *)((long)GA->block_dims + lVar31 + -4) == 0) {
          uVar25 = *(ushort *)((long)GA->dims + lVar31 + -0x30);
          lVar16 = (long)(short)uVar25;
          lVar20 = *(long *)((long)GA->old_nblock + lVar31 + -0x30);
          if (lVar20 == 0) {
            lVar20 = 0;
            if (0 < lVar16) {
              lVar20 = lVar16;
            }
            lVar13 = 1;
            for (lVar27 = 0; lVar20 != lVar27; lVar27 = lVar27 + 1) {
              lVar13 = lVar13 * *(int *)((long)GA->dims + lVar27 * 4 + local_338 + -0x30);
            }
            if (lVar14 < lVar13) {
              lVar29 = 0;
              lVar13 = lVar14;
              for (lVar27 = 0; lVar20 != lVar27; lVar27 = lVar27 + 1) {
                lVar19 = (long)GA[g_a + 1000].nblock[lVar27];
                lVar30 = (lVar13 % lVar19) * 8 + *(long *)(GA->name + lVar31 + -8);
                _lo[lVar27] = *(Integer *)(lVar30 + lVar29 * 8);
                if (lVar13 % lVar19 == lVar19 + -1) {
                  CVar17 = GA[g_a + 1000].dims[lVar27];
                }
                else {
                  CVar17 = *(long *)(lVar30 + 8 + lVar29 * 8) + -1;
                }
                lVar29 = lVar29 + lVar19;
                _hi[lVar27] = CVar17;
                lVar13 = lVar13 / lVar19;
                uVar10 = local_320;
              }
            }
            else {
              for (lVar31 = 0; lVar20 != lVar31; lVar31 = lVar31 + 1) {
                _lo[lVar31] = 0;
                _hi[lVar31] = -1;
              }
            }
          }
          else if (lVar14 < lVar20) {
            lVar20 = 0;
            if (0 < lVar16) {
              lVar20 = lVar16;
            }
            lVar13 = 1;
            for (lVar27 = 0; lVar20 != lVar27; lVar27 = lVar27 + 1) {
              lVar13 = lVar13 * *(int *)((long)GA->dims + lVar27 * 4 + local_338 + -0x30);
            }
            if (lVar14 < lVar13) {
              lVar29 = 0;
              lVar13 = lVar14;
              for (lVar27 = 0; lVar20 != lVar27; lVar27 = lVar27 + 1) {
                lVar19 = (long)GA[g_a + 1000].nblock[lVar27];
                lVar30 = (lVar13 % lVar19) * 8 + *(long *)(GA->name + lVar31 + -8);
                _lo[lVar27] = *(Integer *)(lVar30 + lVar29 * 8);
                if (lVar13 % lVar19 == lVar19 + -1) {
                  CVar17 = GA[g_a + 1000].dims[lVar27];
                }
                else {
                  CVar17 = *(long *)(lVar30 + 8 + lVar29 * 8) + -1;
                }
                lVar29 = lVar29 + lVar19;
                _hi[lVar27] = CVar17;
                lVar13 = lVar13 / lVar19;
                uVar10 = local_320;
              }
            }
            else {
              for (lVar31 = 0; lVar20 != lVar31; lVar31 = lVar31 + 1) {
                _lo[lVar31] = 0;
                _hi[lVar31] = -1;
              }
            }
          }
          else {
            uVar8 = 0;
            if (0 < (short)uVar25) {
              uVar8 = uVar25;
            }
            for (uVar28 = 0; uVar8 != uVar28; uVar28 = uVar28 + 1) {
              _lo[uVar28] = 0;
              _hi[uVar28] = -1;
            }
          }
          iVar22 = *(int *)((long)GA->block_dims + uVar10 + -0x18);
          pgVar24 = GA;
          tproc = lVar14;
          local_328 = lVar16;
          for (lVar31 = 0; lVar31 < (short)uVar25; lVar31 = lVar31 + 1) {
            if ((pIVar21[lVar31] < _lo[lVar31]) || (_hi[lVar31] < pIVar21[lVar31])) {
              sprintf((char *)_index2,"check subscript failed:%ld not in (%ld:%ld) dim=%d");
              pnga_error((char *)_index2,lVar31);
              uVar25 = *(ushort *)((long)GA->dims + uVar10 + -0x30);
              pgVar24 = GA;
            }
          }
          lVar31 = 0;
          if (0 < lVar16 + -1) {
            lVar31 = lVar16 + -1;
          }
          lVar13 = 0;
          lVar20 = 1;
          for (lVar27 = 0; lVar31 != lVar27; lVar27 = lVar27 + 1) {
            lVar13 = lVar13 + ((pgVar24[g_a + 1000].width[lVar27] + pIVar21[lVar27]) - _lo[lVar27])
                              * lVar20;
            lVar20 = lVar20 * (((pgVar24[g_a + 1000].width[lVar27] * 2 + 1) - _lo[lVar27]) +
                              _hi[lVar27]);
          }
          lVar31 = lVar14;
          if (iVar22 == 0) {
            lVar31 = (long)PGRP_LIST->inv_map_proc_list[lVar14];
          }
          if (0 < *(long *)((long)pgVar24->old_nblock + uVar10 + -0x30)) {
            lVar31 = *(long *)(*(long *)((long)pgVar24->old_nblock + uVar10 + -0x38) + lVar31 * 8);
          }
          local_358[local_348] =
               (void *)((long)*(int *)((long)pgVar24->dims + uVar10 + -0x18) *
                        (((pIVar21[local_328 + -1] - _lo[local_328 + -1]) +
                         *(long *)((long)pgVar24->width + lVar16 * 8 + uVar10 + -8)) * lVar20 +
                        lVar13) + *(long *)(*(long *)(pgVar24->name + uVar10 + -0x10) + lVar31 * 8))
          ;
        }
        else {
          lVar11 = pnga_locate(g_a,pIVar21,&tproc);
          if (lVar11 == 0) {
            gai_print_subscript("invalid subscript for block-cyclic array",local_364,pIVar21,"\n");
            pnga_error("failed -element:",idx);
          }
          pnga_distribution(g_a,tproc,lo,hi);
          ptr = local_358 + local_348;
          pnga_access_block_ptr(g_a,tproc,ptr,ld);
          lVar20 = 0;
          lVar31 = 1;
          for (uVar28 = 0; uVar18 != uVar28; uVar28 = uVar28 + 1) {
            lVar20 = lVar20 + (pIVar21[uVar28] - lo[uVar28]) * lVar31;
            lVar31 = lVar31 * ld[uVar28];
          }
          *ptr = (void *)((long)*ptr +
                         ((pIVar21[local_330 + -1] - lo[local_330 + -1]) * lVar31 + lVar20) * lVar15
                         );
        }
        local_378[local_348] = (void *)(idx * lVar15 + (long)v);
        lVar20 = local_348 + 1;
        lVar31 = uVar10;
      }
      if (lVar6 < 1) {
        tproc = lVar14;
        if (-1 < iVar4) {
          tproc = (Integer)PGRP_LIST[lVar32].inv_map_proc_list[lVar14];
        }
      }
      else {
        tproc = *(Integer *)(*(long *)((long)GA->old_nblock + lVar31 + -0x38) + lVar14 * 8);
      }
      iVar22 = (int)tproc;
      if (local_33c == -99) {
        desc.bytes = local_368;
        desc.src_ptr_array = local_378;
        desc.dst_ptr_array = local_358;
        desc.ptr_array_len = (int)local_380[lVar14];
        local_38c = ARMCI_PutV(&desc,1,iVar22);
        if (local_38c == 0) {
LAB_0017953d:
          local_38c = 0;
          goto LAB_001795bd;
        }
        lVar20 = (long)local_38c;
        string = "scatter failed in armci";
      }
      else if (local_33c == -0x61) {
        desc.bytes = local_368;
        desc.src_ptr_array = local_378;
        desc.dst_ptr_array = local_358;
        desc.ptr_array_len = (int)local_380[lVar14];
        if (alpha != (void *)0x0) {
          switch(iVar5) {
          case 0x3e9:
            op_00 = 0x25;
            break;
          case 0x3ea:
            op_00 = 0x2a;
            break;
          case 0x3eb:
            op_00 = 0x27;
            break;
          case 0x3ec:
            op_00 = 0x26;
            break;
          default:
            pnga_error("type not supported",(long)iVar5);
            iVar22 = (int)tproc;
            op_00 = -1;
            break;
          case 0x3ee:
            op_00 = 0x28;
            break;
          case 0x3ef:
            op_00 = 0x29;
          }
          local_38c = ARMCI_AccV(op_00,alpha,&desc,1,iVar22);
        }
        if (local_38c == 0) {
          local_38c = 0;
          goto LAB_001795bd;
        }
        lVar20 = (long)local_38c;
        string = "scatter_acc failed in armci";
      }
      else if (local_33c == -0x62) {
        desc.bytes = local_368;
        desc.src_ptr_array = local_358;
        desc.dst_ptr_array = local_378;
        desc.ptr_array_len = (int)local_380[lVar14];
        local_38c = ARMCI_GetV(&desc,1,iVar22);
        if (local_38c == 0) goto LAB_0017953d;
        string = "gather failed in armci";
        lVar20 = (long)local_38c;
      }
      else {
        string = "operation not supported";
        lVar20 = lVar12;
      }
      pnga_error(string,lVar20);
    }
LAB_001795bd:
    lVar14 = lVar14 + 1;
  } while( true );
}

Assistant:

void gai_gatscat_new(int op, Integer g_a, void* v, void *subscript,
                     Integer c_flag, Integer nv, double *locbytes,
                     double* totbytes, void *alpha)
{
    Integer handle=g_a+GA_OFFSET;
    int  ndim, i, j, k, type, item_size;
    Integer idx, p_handle, num_rstrctd;
    Integer *proc;
    Integer nprocs, me, iproc, tproc, index[MAXDIM];
    Integer lo[MAXDIM], hi[MAXDIM], ld[MAXDIM-1];
    Integer jtot, last, offset;
    Integer *subscript_ptr;

    Integer *header, *list, *nelems;
    char *buf;
    void **ptr_rem, **ptr_loc; 
    int rc, maxlen;
    int *nblock;
    armci_giov_t desc;

    

    me = pnga_nodeid();
    num_rstrctd = GA[handle].num_rstrctd;
    nblock = GA[handle].nblock;

    /* determine how many processors are associated with array */
    p_handle = GA[handle].p_handle;
    if (p_handle < 0) {
      nprocs = GAnproc;
      if (num_rstrctd > 0) nprocs = num_rstrctd;
    } else {
      nprocs = PGRP_LIST[p_handle].map_nproc;
    }

    if (!GA_prealloc_gatscat) {
      header =(Integer *)pnga_malloc(nprocs, MT_F_INT, "ga_gat_header");
      list =(Integer *)pnga_malloc(nv, MT_F_INT, "ga_gat_list");
      nelems =(Integer *)pnga_malloc(nprocs, MT_F_INT, "ga_gat_nelems");
    } else {
      if (GA_prealloc_gatscat < nv)
        pnga_error("Gather/scatter vector exceeds allocation length ",
                   GA_prealloc_gatscat);
      header = (Integer*)GA_header;
      list = (Integer*)GA_list;
      nelems = (Integer*)GA_elems;
    }

    ndim = GA[handle].ndim;
    type = GA[handle].type;
    item_size = GA[handle].elemsize;
    *totbytes = item_size * nv;

    /* Initialize linked list data structures */
    for (i=0; i<nprocs; i++) {
      nelems[i] = 0;
      header[i] = -1;
    }
    for (i=0; i<nv; i++) {
      list[i] = 0;
    }

    /* Set up linked list that partitions elements defined in subscripts array
     * into groups corresponding to the elements home processor
     */
    maxlen = 1;
    for (i=0; i<nv; i++) {
      if (c_flag) {
        gam_c2f_index(((int**)subscript)[i], index, ndim);
        subscript_ptr = index;
      } else {
        subscript_ptr = ((Integer*)subscript)+i*ndim;
      }
      if(!pnga_locate(g_a, subscript_ptr, &idx)) {
        gai_print_subscript("invalid subscript",ndim, subscript_ptr,"\n");
        pnga_error("failed -element:",i);
      }
      if (num_rstrctd > 0) idx = GA[handle].rank_rstrctd[idx];
      /* map from block to processor, if necessary */
      if (GA[handle].distr_type == BLOCK_CYCLIC) {
        idx = idx%nprocs;
      } else if (GA[handle].distr_type == SCALAPACK) {
        gam_find_block_indices(handle,idx,index);
        for (j=0; j<ndim; j++) {
          index[j] = index[j]%nblock[j];
        }
        gam_find_proc_from_sl_indices(handle,idx,index);
      } else if (GA[handle].distr_type == TILED ||
          GA[handle].distr_type == TILED_IRREG) {
        gam_find_block_indices(handle,idx,index);
        for (j=0; j<ndim; j++) {
          index[j] = index[j]%nblock[j];
        }
        gam_find_tile_proc_from_indices(handle,idx,index);
      }
      nelems[idx]++;
      if (maxlen<nelems[idx]) maxlen=nelems[idx];
      j = header[idx];
      header[idx] = i;
      list[i] = j;
    }
    *locbytes = item_size * nelems[me];

    /* allocate buffers for individual vector calls */
    buf = (char*)malloc(2*maxlen*sizeof(void*));
    ptr_loc = (void**)buf;
    ptr_rem = (void**)(buf+maxlen*sizeof(void*));

    for (iproc=0; iproc<nprocs; iproc++) {
      if (nelems[iproc] > 0) {
        /* loop through linked list to find all data elements associated with
         * the remote processor iproc
         */
        idx = header[iproc];
        j = 0;
        while (idx > -1) {
          if (c_flag) {
            gam_c2f_index(((int**)subscript)[idx], index, ndim);
            subscript_ptr = index;
          } else {
            subscript_ptr = ((Integer*)subscript)+idx*ndim;
          }
          if (GA[handle].distr_type == REGULAR) {
          /* gam_Loc_ptr modifies the value of the processor variable for
           * restricted arrays or processor groups, so make a temporary copy
           */
            tproc = iproc;
            gam_Loc_ptr(tproc, handle,  (subscript_ptr),
                ptr_rem+j);
          } else {
            /* TODO: Figure out how to get correct pointers for block cyclic
             * distributions */
            /* find block index from subscript */
            if(!pnga_locate(g_a, subscript_ptr, &tproc)) {
              gai_print_subscript("invalid subscript for block-cyclic array",
                                   ndim, subscript_ptr,"\n");
              pnga_error("failed -element:",idx);
            }
            pnga_distribution(g_a, tproc, lo, hi);
            pnga_access_block_ptr(g_a, tproc, ptr_rem+j, ld);
            pnga_release_block(g_a, tproc);
            offset = 0;
            last = ndim -1;
            jtot = 1;
            for (k=0; k<last; k++) {
              offset += ((subscript_ptr)[k]-lo[k])*jtot;
              jtot *= ld[k];
            }
            offset += ((subscript_ptr)[last]-lo[last])*jtot;
            ptr_rem[j] = (void*)(((char*)ptr_rem[j])+offset*item_size);
          }
          ptr_loc[j] = (void*)(((char*)v) + idx * item_size);
          idx = list[idx];
          j++;
        }
        /* correct remote proc if restricted arrays or processor groups are
         * being used
         */
        if (num_rstrctd > 0) {
          tproc = GA[handle].rstrctd_list[iproc];
        } else {
          if (p_handle < 0) {
            tproc = iproc;
          } else {
            tproc = PGRP_LIST[p_handle].inv_map_proc_list[iproc];
          }
        }
        /* perform vector operation */
        switch(op) { 
          case GATHER:
            desc.bytes = (int)item_size;
            desc.src_ptr_array = ptr_rem;
            desc.dst_ptr_array = ptr_loc;
            desc.ptr_array_len = (int)nelems[iproc];
            rc=ARMCI_GetV(&desc, 1, (int)tproc);
            if(rc) pnga_error("gather failed in armci",rc);
            break;
          case SCATTER:
            desc.bytes = (int)item_size;
            desc.src_ptr_array = ptr_loc;
            desc.dst_ptr_array = ptr_rem;
            desc.ptr_array_len = (int)nelems[iproc];
            rc=ARMCI_PutV(&desc, 1, (int)tproc);
            if(rc) pnga_error("scatter failed in armci",rc);
            break;
          case SCATTER_ACC:
            desc.bytes = (int)item_size;
            desc.src_ptr_array = ptr_loc;
            desc.dst_ptr_array = ptr_rem;
            desc.ptr_array_len = (int)nelems[iproc];
            if(alpha != NULL) {
              int optype=-1;
              if(type==C_DBL) optype= ARMCI_ACC_DBL;
              else if(type==C_DCPL)optype= ARMCI_ACC_DCP;
              else if(type==C_SCPL)optype= ARMCI_ACC_CPL;
              else if(type==C_INT)optype= ARMCI_ACC_INT;
              else if(type==C_LONG)optype= ARMCI_ACC_LNG;
              else if(type==C_FLOAT)optype= ARMCI_ACC_FLT; 
              else pnga_error("type not supported",type);
              rc= ARMCI_AccV(optype, alpha, &desc, 1, (int)tproc);
            }
            if(rc) pnga_error("scatter_acc failed in armci",rc);
            break;
          default: pnga_error("operation not supported",op);
        }
      }
    }
    free(buf);
    if (!GA_prealloc_gatscat) {
      pnga_free(nelems);
      pnga_free(list);
      pnga_free(header);
    }

}